

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_core.hpp
# Opt level: O3

void __thiscall
boost::threadpool::detail::
pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
::pool_core(pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
            *this)

{
  static_size<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
  *psVar1;
  deque<boost::function0<void>,_std::allocator<boost::function0<void>_>_> *pdVar2;
  _Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_> *p_Var3;
  _Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_> *p_Var4;
  static_size<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
  *psVar5;
  undefined1 auVar7 [32];
  undefined1 auVar6 [64];
  undefined1 auVar8 [32];
  
  (this->
  super_enable_shared_from_this<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
  ).weak_this_.px = (element_type *)0x0;
  (this->
  super_enable_shared_from_this<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
  ).weak_this_.pn.pi_ = (sp_counted_base *)0x0;
  auVar6 = ZEXT464(0) << 0x40;
  this->m_worker_count = 0;
  this->m_target_worker_count = 0;
  this->m_active_worker_count = 0;
  pdVar2 = &(this->m_scheduler).m_container;
  auVar7 = auVar6._16_32_;
  p_Var3 = &pdVar2->
            super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>;
  (pdVar2->super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>).
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)auVar6._0_8_;
  (pdVar2->super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>).
  _M_impl.super__Deque_impl_data._M_map_size = auVar6._8_8_;
  (p_Var3->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)auVar7._0_8_;
  (p_Var3->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)auVar7._8_8_;
  (p_Var3->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)auVar7._16_8_;
  (p_Var3->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)auVar7._24_8_;
  (pdVar2->super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>).
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)auVar6._48_8_;
  (pdVar2->super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>).
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)auVar6._56_8_;
  pdVar2 = &(this->m_scheduler).m_container;
  auVar7 = auVar6._0_32_;
  auVar8 = auVar6._32_32_;
  p_Var3 = &pdVar2->
            super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>;
  p_Var4 = &pdVar2->
            super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>;
  (p_Var3->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)auVar7._0_8_;
  (p_Var3->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)auVar7._8_8_;
  (p_Var3->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)auVar7._16_8_;
  (p_Var3->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)auVar7._24_8_;
  (p_Var4->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)auVar8._0_8_;
  (p_Var4->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)auVar8._8_8_;
  (p_Var4->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)auVar8._16_8_;
  (p_Var4->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)auVar8._24_8_;
  std::_Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>::
  _M_initialize_map((_Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_> *
                    )&this->m_scheduler,0);
  (this->m_size_policy).px =
       (static_size<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
        *)0x0;
  this->m_terminate_all_workers = false;
  (this->m_terminated_workers).
  super__Vector_base<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>,_std::allocator<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_terminated_workers).
  super__Vector_base<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>,_std::allocator<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_terminated_workers).
  super__Vector_base<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>,_std::allocator<boost::shared_ptr<boost::threadpool::detail::worker_thread<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  recursive_mutex::recursive_mutex(&this->m_monitor);
  condition_variable_any::condition_variable_any(&this->m_worker_idle_or_terminated_event);
  condition_variable_any::condition_variable_any(&this->m_task_or_terminate_workers_event);
  psVar5 = (static_size<boost::threadpool::detail::pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>_>
            *)operator_new(8);
  (psVar5->m_pool).t_ = this;
  psVar1 = (this->m_size_policy).px;
  (this->m_size_policy).px = psVar5;
  operator_delete(psVar1);
  std::deque<boost::function0<void>,_std::allocator<boost::function0<void>_>_>::clear
            (&(this->m_scheduler).m_container);
  return;
}

Assistant:

pool_core()
      : m_worker_count(0) 
      , m_target_worker_count(0)
      , m_active_worker_count(0)
      , m_terminate_all_workers(false)
    {
      pool_type volatile & self_ref = *this;
      m_size_policy.reset(new size_policy_type(self_ref));

      m_scheduler.clear();
    }